

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentTextureWorkloadCullCase::init
          (FragmentTextureWorkloadCullCase *this,EVP_PKEY_CTX *ctx)

{
  TexPtr *this_00;
  int iVar1;
  int extraout_EAX;
  undefined4 extraout_var;
  void *__s;
  ObjectWrapper *this_01;
  ObjectTraits *traits;
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  local_38;
  Functions *gl;
  
  iVar1 = (*((this->super_FragmentWorkloadCullCase).super_RelativeChangeCase.super_BaseCase.
            m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  __s = operator_new(0x10000);
  memset(__s,0xff,0x10000);
  this_01 = (ObjectWrapper *)operator_new(0x18);
  traits = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(this_01,gl,traits);
  local_38.m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)0> *)0x0;
  this_00 = &this->m_texture;
  if (&((this->m_texture).
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
        .m_data.ptr)->super_ObjectWrapper != this_01) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
    ::reset(&this_00->
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
           );
    (this_00->
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
    ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)0> *)this_01;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  ::reset(&local_38);
  (*gl->bindTexture)(0xde1,(uint)((this_00->
                                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
                                  ).m_data.ptr != (TypedObjectWrapper<(glu::ObjectType)0> *)0x0));
  (*gl->texImage2D)(0xde1,0,0x8058,0x80,0x80,0,0x1908,0x1401,__s);
  (*gl->texParameteri)(0xde1,0x2801,0x2600);
  (*gl->texParameteri)(0xde1,0x2800,0x2600);
  operator_delete(__s,0x10000);
  return extraout_EAX;
}

Assistant:

void FragmentTextureWorkloadCullCase::init (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const int				size	= 128;
	const vector<deUint8>	data	(size*size*4, 255);

	m_texture = MovePtr<glu::Texture>(new glu::Texture(gl));

	gl.bindTexture(GL_TEXTURE_2D, m_texture);
	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size, size, 0, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
}